

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fold.cpp
# Opt level: O1

int __thiscall ncnn::Fold::forward(Fold *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  int *piVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  int iVar9;
  float *pfVar10;
  int iVar11;
  int iVar12;
  void *__s;
  size_t sVar13;
  int _w;
  int iVar14;
  ulong uVar15;
  ulong uVar16;
  float *pfVar17;
  int iVar18;
  uint uVar19;
  long lVar20;
  uint uVar21;
  bool bVar22;
  int size;
  Option opt_b;
  Mat local_128;
  size_t local_d8;
  ulong local_d0;
  Fold *local_c8;
  size_t local_c0;
  Option *local_b8;
  long local_b0;
  size_t local_a8;
  long local_a0;
  void *local_98;
  ulong local_90;
  long local_88;
  void *local_80;
  Option local_78;
  
  _w = this->output_w + this->pad_left + this->pad_right;
  iVar11 = this->output_h + this->pad_top + this->pad_bottom;
  uVar21 = this->kernel_h * this->kernel_w;
  local_c0 = (size_t)uVar21;
  local_d8 = bottom_blob->elemsize;
  uVar19 = (~((this->kernel_w + -1) * this->dilation_w) + _w) / this->stride_w;
  iVar14 = (~((this->kernel_h + -1) * this->dilation_h) + iVar11) / this->stride_h;
  iVar9 = bottom_blob->h / (int)uVar21;
  local_d0 = CONCAT44(local_d0._4_4_,iVar9);
  local_128.cstep = 0;
  local_128.data = (void *)0x0;
  local_128.refcount._0_4_ = 0;
  local_128.refcount._4_4_ = 0;
  local_128.elemsize._0_4_ = 0;
  local_128.elemsize._4_4_ = 0;
  local_128.elempack = 0;
  local_128.allocator = (Allocator *)0x0;
  local_128.dims = 0;
  local_128.w = 0;
  local_128.h = 0;
  local_128.d = 0;
  local_128.c = 0;
  lVar20 = 0x10;
  if (((this->pad_bottom < 1 && this->pad_top < 1) && (this->pad_right < 1 && this->pad_left < 1))
     && (lVar20 = 8, &local_128 != top_blob)) {
    piVar4 = top_blob->refcount;
    if (piVar4 != (int *)0x0) {
      LOCK();
      *piVar4 = *piVar4 + 1;
      UNLOCK();
    }
    local_128.data = top_blob->data;
    local_128.refcount._0_4_ = SUB84(top_blob->refcount,0);
    local_128.refcount._4_4_ = (undefined4)((ulong)top_blob->refcount >> 0x20);
    local_128.elemsize._0_4_ = (undefined4)top_blob->elemsize;
    local_128.elemsize._4_4_ = (undefined4)(top_blob->elemsize >> 0x20);
    local_128.elempack = top_blob->elempack;
    local_128.allocator = top_blob->allocator;
    uVar5 = top_blob->dims;
    uVar6 = top_blob->w;
    uVar7 = top_blob->h;
    uVar8 = top_blob->d;
    local_128.c = top_blob->c;
    local_128.cstep = top_blob->cstep;
    local_128.dims = uVar5;
    local_128.w = uVar6;
    local_128.h = uVar7;
    local_128.d = uVar8;
  }
  local_c8 = this;
  local_b8 = opt;
  Mat::create(&local_128,_w,iVar11,iVar9,local_d8,*(Allocator **)(&opt->lightmode + lVar20));
  iVar9 = -100;
  if ((local_128.data == (void *)0x0) || ((long)local_128.c * local_128.cstep == 0))
  goto LAB_005d3529;
  if (0 < (int)local_d0) {
    iVar9 = local_c8->stride_w;
    iVar11 = local_c8->stride_h;
    local_98 = bottom_blob->data;
    local_80 = local_128.data;
    uVar15 = CONCAT44(local_128.elemsize._4_4_,(undefined4)local_128.elemsize);
    local_88 = local_128.cstep * uVar15;
    lVar20 = (long)local_128.h * (long)local_128.w;
    sVar13 = 0;
    iVar2 = (int)((uVar15 * lVar20 + 0xf & 0xfffffffffffffff0) / uVar15);
    if (local_128.dims == 4) {
      iVar2 = (int)lVar20;
    }
    local_90 = (ulong)(uint)(iVar2 * local_128.d);
    uVar21 = local_c8->kernel_w;
    uVar1 = local_c8->kernel_h;
    local_a0 = uVar15 * (long)local_128.w;
    local_a8 = local_90 * 4;
    local_b0 = (long)(int)local_c0 * (long)bottom_blob->w * bottom_blob->elemsize;
    local_c0 = local_d0 & 0xffffffff;
    do {
      __s = (void *)(local_88 * sVar13 + (long)local_80);
      local_d8 = sVar13;
      if (0 < (int)local_90) {
        memset(__s,0,local_a8);
      }
      if (0 < (int)uVar1) {
        pfVar10 = (float *)(local_d8 * local_b0 + (long)local_98);
        local_d0 = local_c8->dilation_h * local_a0;
        iVar2 = local_c8->dilation_w;
        uVar15 = 0;
        do {
          if (0 < (int)uVar21) {
            uVar16 = 0;
            do {
              if (-1 < iVar14) {
                pfVar17 = (float *)((long)__s + uVar16 * (long)iVar2 * 4 + uVar15 * local_d0);
                iVar3 = local_c8->stride_w;
                iVar18 = 0;
                do {
                  iVar12 = uVar19 + 1;
                  if (-1 < (int)uVar19) {
                    do {
                      *pfVar17 = *pfVar17 + *pfVar10;
                      pfVar10 = pfVar10 + 1;
                      pfVar17 = pfVar17 + iVar3;
                      iVar12 = iVar12 + -1;
                    } while (iVar12 != 0);
                  }
                  pfVar17 = pfVar17 + (int)(_w * iVar11 + ~uVar19 * iVar9);
                  bVar22 = iVar18 != iVar14;
                  iVar18 = iVar18 + 1;
                } while (bVar22);
              }
              uVar16 = uVar16 + 1;
            } while (uVar16 != uVar21);
          }
          uVar15 = uVar15 + 1;
        } while (uVar15 != uVar1);
      }
      sVar13 = local_d8 + 1;
    } while (sVar13 != local_c0);
  }
  if ((local_c8->pad_bottom < 1 && local_c8->pad_top < 1) &&
      (local_c8->pad_right < 1 && local_c8->pad_left < 1)) {
    if (&local_128 != top_blob) {
      piVar4 = (int *)CONCAT44(local_128.refcount._4_4_,local_128.refcount._0_4_);
      if (piVar4 != (int *)0x0) {
        LOCK();
        *piVar4 = *piVar4 + 1;
        UNLOCK();
      }
      piVar4 = top_blob->refcount;
      if (piVar4 != (int *)0x0) {
        LOCK();
        *piVar4 = *piVar4 + -1;
        UNLOCK();
        if (*piVar4 == 0) {
          if (top_blob->allocator == (Allocator *)0x0) {
            if (top_blob->data != (void *)0x0) {
              free(top_blob->data);
            }
          }
          else {
            (*top_blob->allocator->_vptr_Allocator[3])();
          }
        }
      }
      top_blob->cstep = 0;
      top_blob->data = (void *)0x0;
      top_blob->refcount = (int *)0x0;
      *(undefined8 *)((long)&top_blob->refcount + 4) = 0;
      *(undefined8 *)((long)&top_blob->elemsize + 4) = 0;
      top_blob->dims = 0;
      top_blob->w = 0;
      top_blob->h = 0;
      top_blob->d = 0;
      top_blob->c = 0;
      top_blob->data = local_128.data;
      top_blob->refcount = (int *)CONCAT44(local_128.refcount._4_4_,local_128.refcount._0_4_);
      top_blob->elemsize = CONCAT44(local_128.elemsize._4_4_,(undefined4)local_128.elemsize);
      top_blob->elempack = local_128.elempack;
      top_blob->allocator = local_128.allocator;
      top_blob->dims = local_128.dims;
      top_blob->w = local_128.w;
      top_blob->h = local_128.h;
      top_blob->d = local_128.d;
      top_blob->c = local_128.c;
      top_blob->cstep = local_128.cstep;
    }
  }
  else {
    local_78.lightmode = local_b8->lightmode;
    local_78.use_shader_pack8 = local_b8->use_shader_pack8;
    local_78.use_subgroup_ops = local_b8->use_subgroup_ops;
    local_78.use_reserved_0 = local_b8->use_reserved_0;
    local_78.num_threads = local_b8->num_threads;
    local_78.blob_allocator = local_b8->blob_allocator;
    local_78.workspace_allocator = local_b8->workspace_allocator;
    local_78.openmp_blocktime = local_b8->openmp_blocktime;
    local_78.use_winograd_convolution = local_b8->use_winograd_convolution;
    local_78.use_sgemm_convolution = local_b8->use_sgemm_convolution;
    local_78.use_int8_inference = local_b8->use_int8_inference;
    local_78.use_vulkan_compute = local_b8->use_vulkan_compute;
    uVar15._0_1_ = local_b8->use_bf16_storage;
    uVar15._1_1_ = local_b8->use_fp16_packed;
    uVar15._2_1_ = local_b8->use_fp16_storage;
    uVar15._3_1_ = local_b8->use_fp16_arithmetic;
    uVar15._4_1_ = local_b8->use_int8_packed;
    uVar15._5_1_ = local_b8->use_int8_storage;
    uVar15._6_1_ = local_b8->use_int8_arithmetic;
    uVar15._7_1_ = local_b8->use_packing_layout;
    local_78.vulkan_device_index = local_b8->vulkan_device_index;
    local_78.use_reserved_1 = local_b8->use_reserved_1;
    local_78.use_image_storage = local_b8->use_image_storage;
    local_78.use_tensor_storage = local_b8->use_tensor_storage;
    local_78.use_reserved_2 = local_b8->use_reserved_2;
    local_78.flush_denormals = local_b8->flush_denormals;
    local_78.use_local_pool_allocator = local_b8->use_local_pool_allocator;
    local_78.use_shader_local_memory = local_b8->use_shader_local_memory;
    local_78.use_cooperative_matrix = local_b8->use_cooperative_matrix;
    local_78.use_winograd23_convolution = local_b8->use_winograd23_convolution;
    local_78.use_winograd43_convolution = local_b8->use_winograd43_convolution;
    local_78.use_winograd63_convolution = local_b8->use_winograd63_convolution;
    local_78.use_a53_a55_optimized_kernel = local_b8->use_a53_a55_optimized_kernel;
    local_78.use_fp16_uniform = local_b8->use_fp16_uniform;
    local_78.use_int8_uniform = local_b8->use_int8_uniform;
    local_78.use_reserved_9 = local_b8->use_reserved_9;
    local_78.use_reserved_10 = local_b8->use_reserved_10;
    local_78.use_reserved_11 = local_b8->use_reserved_11;
    local_78._32_8_ = uVar15 & 0xffffffffffffff;
    copy_cut_border(&local_128,top_blob,local_c8->pad_top,local_c8->pad_bottom,local_c8->pad_left,
                    local_c8->pad_right,&local_78);
    if (top_blob->data == (void *)0x0) {
      iVar9 = -100;
      goto LAB_005d3529;
    }
    iVar9 = -100;
    if ((long)top_blob->c * top_blob->cstep == 0) goto LAB_005d3529;
  }
  iVar9 = 0;
LAB_005d3529:
  piVar4 = (int *)CONCAT44(local_128.refcount._4_4_,local_128.refcount._0_4_);
  if (piVar4 != (int *)0x0) {
    LOCK();
    *piVar4 = *piVar4 + -1;
    UNLOCK();
    if (*piVar4 == 0) {
      if (local_128.allocator == (Allocator *)0x0) {
        if (local_128.data != (void *)0x0) {
          free(local_128.data);
        }
      }
      else {
        (*(local_128.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar9;
}

Assistant:

int Fold::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    const int max_channels = bottom_blob.h;
    size_t elemsize = bottom_blob.elemsize;

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;
    const int kernel_extent_h = dilation_h * (kernel_h - 1) + 1;

    const int outw = output_w + pad_left + pad_right;
    const int outh = output_h + pad_top + pad_bottom;

    const int inw = (outw - kernel_extent_w) / stride_w + 1;
    const int inh = (outh - kernel_extent_h) / stride_h + 1;

    // assert inw * inh == size

    const int maxk = kernel_w * kernel_h;
    const int channels = max_channels / maxk;

    Mat top_blob_bordered;
    if (pad_left > 0 || pad_right > 0 || pad_top > 0 || pad_bottom > 0)
    {
        top_blob_bordered.create(outw, outh, channels, elemsize, opt.workspace_allocator);
    }
    else
    {
        top_blob_bordered = top_blob;
        top_blob_bordered.create(outw, outh, channels, elemsize, opt.blob_allocator);
    }
    if (top_blob_bordered.empty())
        return -100;

    // col2im
    const int gap = outw * stride_h - inw * stride_w;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int p = 0; p < channels; p++)
    {
        const float* sptr = bottom_blob.row(p * maxk);
        Mat outm = top_blob_bordered.channel(p);

        outm.fill(0.f);

        for (int u = 0; u < kernel_h; u++)
        {
            for (int v = 0; v < kernel_w; v++)
            {
                float* ptr = outm.row(dilation_h * u) + dilation_w * v;

                for (int i = 0; i < inh; i++)
                {
                    for (int j = 0; j < inw; j++)
                    {
                        ptr[0] += sptr[0];

                        ptr += stride_w;
                        sptr += 1;
                    }

                    ptr += gap;
                }
            }
        }
    }

    if (pad_left > 0 || pad_right > 0 || pad_top > 0 || pad_bottom > 0)
    {
        Option opt_b = opt;
        opt_b.use_packing_layout = false;
        copy_cut_border(top_blob_bordered, top_blob, pad_top, pad_bottom, pad_left, pad_right, opt_b);
        if (top_blob.empty())
            return -100;
    }
    else
    {
        top_blob = top_blob_bordered;
    }

    return 0;
}